

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void run_app(int argc,char **argv,SDL_Window *window)

{
  float fVar1;
  char *pcVar2;
  bool bVar3;
  _func_void_GLenum_GLint_GLint_GLsizei_GLint_GLenum_GLenum_void_ptr *p_Var4;
  bool bVar5;
  Uint32 UVar6;
  stbi_uc *__first;
  size_type sVar7;
  uchar *puVar8;
  ImGuiIO *pIVar9;
  ImDrawData *draw_data;
  int iVar10;
  undefined1 local_1f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> colormap_1;
  SDL_Event event;
  undefined1 local_198 [7];
  bool done;
  Shader display_colormap;
  undefined1 local_150 [4];
  GLuint vao;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colormap;
  GLuint colormap_texture;
  Colormap local_110;
  allocator<unsigned_char> local_c9;
  undefined1 local_c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> img;
  uint8_t *img_data;
  int n;
  int h;
  int w;
  int i;
  TransferFunctionWidget tfn_widget;
  ImGuiIO *io;
  SDL_Window *window_local;
  char **argv_local;
  int argc_local;
  
  tfn_widget._88_8_ = ImGui::GetIO();
  tfnw::TransferFunctionWidget::TransferFunctionWidget((TransferFunctionWidget *)&w);
  for (h = 1; h < argc; h = h + 1) {
    __first = stbi_load(argv[h],&n,(int *)((long)&img_data + 4),(int *)&img_data,4);
    iVar10 = n << 2;
    std::allocator<unsigned_char>::allocator(&local_c9);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_c8,__first,
               __first + iVar10,&local_c9);
    std::allocator<unsigned_char>::~allocator(&local_c9);
    stbi_image_free(__first);
    pcVar2 = argv[h];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&colormap_texture,pcVar2,
               (allocator *)
               ((long)&colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    tfnw::Colormap::Colormap
              (&local_110,(string *)&colormap_texture,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,SRGB);
    tfnw::TransferFunctionWidget::add_colormap((TransferFunctionWidget *)&w,&local_110);
    tfnw::Colormap::~Colormap(&local_110);
    std::__cxx11::string::~string((string *)&colormap_texture);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
  }
  (*_ptrc_glGenTextures)
            (1,(GLuint *)
               &colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  (*_ptrc_glBindTexture)
            (0xde0,(GLuint)colormap.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
  (*_ptrc_glTexParameteri)(0xde0,0x2801,0x2601);
  (*_ptrc_glTexParameteri)(0xde0,0x2800,0x2601);
  (*_ptrc_glTexParameteri)(0xde0,0x2802,0x812f);
  tfnw::TransferFunctionWidget::get_colormap
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150,
             (TransferFunctionWidget *)&w);
  p_Var4 = _ptrc_glTexImage1D;
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150);
  (*p_Var4)(0xde0,0,0x8058,(GLsizei)(sVar7 >> 2),0,0x1908,0x1401,puVar8);
  (*_ptrc_glGenVertexArrays)
            (1,(GLuint *)((long)&display_colormap.uniforms._M_h._M_single_bucket + 4));
  (*_ptrc_glBindVertexArray)(display_colormap.uniforms._M_h._M_single_bucket._4_4_);
  (*_ptrc_glClearColor)(0.0,0.0,0.0,1.0);
  (*_ptrc_glDisable)(0xb71);
  (*_ptrc_glEnable)(0xbe2);
  (*_ptrc_glBlendFunc)(1,0x303);
  Shader::Shader((Shader *)local_198,&display_colormap_vs_abi_cxx11_,&display_colormap_fs_abi_cxx11_
                );
  bVar3 = false;
  while (!bVar3) {
    while (iVar10 = SDL_PollEvent(&colormap_1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar10 != 0)
    {
      ImGui_ImplSDL2_ProcessEvent
                ((SDL_Event *)
                 &colormap_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((int)colormap_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 0x100) {
        bVar3 = true;
      }
      if ((((*(byte *)(tfn_widget._88_8_ + 0xc9) & 1) == 0) &&
          ((int)colormap_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage == 0x300)) &&
         (event.motion.which == 0x1b)) {
        bVar3 = true;
      }
      if ((((int)colormap_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage == 0x200) &&
          (event.padding[4] == '\x0e')) && (UVar6 = SDL_GetWindowID(window), event.type == UVar6)) {
        bVar3 = true;
      }
      if (((int)colormap_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage == 0x200) && (event.padding[4] == '\x05')
         ) {
        win_width = event.jaxis.which;
        win_height = event.ctouchpad.touchpad;
        *(float *)(tfn_widget._88_8_ + 8) = (float)event.jaxis.which;
        *(float *)(tfn_widget._88_8_ + 0xc) = (float)win_height;
      }
    }
    bVar5 = tfnw::TransferFunctionWidget::changed((TransferFunctionWidget *)&w);
    if (bVar5) {
      tfnw::TransferFunctionWidget::get_colormap
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f0,
                 (TransferFunctionWidget *)&w);
      p_Var4 = _ptrc_glTexImage1D;
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f0);
      puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f0);
      (*p_Var4)(0xde0,0,0x8058,(GLsizei)(sVar7 >> 2),0,0x1908,0x1401,puVar8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f0);
    }
    ImGui_ImplOpenGL3_NewFrame();
    ImGui_ImplSDL2_NewFrame(window);
    ImGui::NewFrame();
    ImGui::Begin("Debug Panel",(bool *)0x0,0);
    pIVar9 = ImGui::GetIO();
    fVar1 = pIVar9->Framerate;
    pIVar9 = ImGui::GetIO();
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar1),
                (double)pIVar9->Framerate);
    tfnw::TransferFunctionWidget::draw_ui((TransferFunctionWidget *)&w);
    ImGui::End();
    ImGui::Render();
    (*_ptrc_glViewport)(0,0,(int)*(float *)(tfn_widget._88_8_ + 8),
                        (int)*(float *)(tfn_widget._88_8_ + 0xc));
    (*_ptrc_glClear)(0x4100);
    (*_ptrc_glUseProgram)(local_198._0_4_);
    (*_ptrc_glDrawArrays)(5,0,4);
    draw_data = ImGui::GetDrawData();
    ImGui_ImplOpenGL3_RenderDrawData(draw_data);
    SDL_GL_SwapWindow(window);
  }
  Shader::~Shader((Shader *)local_198);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150);
  tfnw::TransferFunctionWidget::~TransferFunctionWidget((TransferFunctionWidget *)&w);
  return;
}

Assistant:

void run_app(int argc, const char **argv, SDL_Window *window)
{
    ImGuiIO &io = ImGui::GetIO();

    tfnw::TransferFunctionWidget tfn_widget;

    // Load any extra colormaps the user wants to see in the demo
    for (int i = 1; i < argc; ++i) {
        int w, h, n;
        uint8_t *img_data = stbi_load(argv[i], &w, &h, &n, 4);
        auto img = std::vector<uint8_t>(img_data, img_data + w * 1 * 4);
        stbi_image_free(img_data);
        // Input images are assumed to be sRGB color-space
        tfn_widget.add_colormap(tfnw::Colormap(argv[i], img, tfnw::SRGB));
    }

    // A texture so we can color the background of the window by the colormap
    GLuint colormap_texture;
    glGenTextures(1, &colormap_texture);
    glBindTexture(GL_TEXTURE_1D, colormap_texture);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    auto colormap = tfn_widget.get_colormap();
    glTexImage1D(GL_TEXTURE_1D,
                 0,
                 GL_RGBA8,
                 colormap.size() / 4,
                 0,
                 GL_RGBA,
                 GL_UNSIGNED_BYTE,
                 colormap.data());

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);

    glClearColor(0.0, 0.0, 0.0, 1.0);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);

    Shader display_colormap(display_colormap_vs, display_colormap_fs);

    bool done = false;
    while (!done) {
        SDL_Event event;
        while (SDL_PollEvent(&event)) {
            ImGui_ImplSDL2_ProcessEvent(&event);
            if (event.type == SDL_QUIT) {
                done = true;
            }
            if (!io.WantCaptureKeyboard && event.type == SDL_KEYDOWN &&
                event.key.keysym.sym == SDLK_ESCAPE) {
                done = true;
            }
            if (event.type == SDL_WINDOWEVENT && event.window.event == SDL_WINDOWEVENT_CLOSE &&
                event.window.windowID == SDL_GetWindowID(window)) {
                done = true;
            }
            if (event.type == SDL_WINDOWEVENT &&
                event.window.event == SDL_WINDOWEVENT_RESIZED) {
                win_width = event.window.data1;
                win_height = event.window.data2;
                io.DisplaySize.x = win_width;
                io.DisplaySize.y = win_height;
            }
        }

        if (tfn_widget.changed()) {
            auto colormap = tfn_widget.get_colormap();
            glTexImage1D(GL_TEXTURE_1D,
                         0,
                         GL_RGBA8,
                         colormap.size() / 4,
                         0,
                         GL_RGBA,
                         GL_UNSIGNED_BYTE,
                         colormap.data());
        }

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplSDL2_NewFrame(window);
        ImGui::NewFrame();

        ImGui::Begin("Debug Panel");
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",
                    1000.0f / ImGui::GetIO().Framerate,
                    ImGui::GetIO().Framerate);
        tfn_widget.draw_ui();
        ImGui::End();

        // Rendering
        ImGui::Render();
        glViewport(0, 0, (int)io.DisplaySize.x, (int)io.DisplaySize.y);

        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        glUseProgram(display_colormap.program);
        glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());

        SDL_GL_SwapWindow(window);
    }
}